

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_msg.c
# Opt level: O1

void * build_pcp_msg(pcp_flow_t *flow)

{
  uint8_t *puVar1;
  uint uVar2;
  uint8_t *puVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  undefined8 uVar7;
  uint8_t uVar8;
  pcp_map_v2_t *map_info;
  pcp_server_t *ppVar9;
  char *pcVar10;
  ulong __n;
  byte bVar11;
  long lVar12;
  
  if ((flow == (pcp_flow_t *)0x0) ||
     (ppVar9 = get_pcp_server(flow->ctx,flow->pcp_server_indx), ppVar9 == (pcp_server_t *)0x0)) {
    return (void *)0x0;
  }
  if (flow->pcp_msg_buffer == (char *)0x0) {
    pcVar10 = (char *)calloc(1,0x44c);
    flow->pcp_msg_buffer = pcVar10;
    if (pcVar10 == (char *)0x0) {
      pcp_logger(PCP_LOGLVL_ERR,"%s","Malloc can\'t allocate enough memory for the pcp_flow.");
      return (void *)0x0;
    }
  }
  puVar3 = (uint8_t *)flow->pcp_msg_buffer;
  if (ppVar9->pcp_version == '\0') {
    uVar8 = (flow->kd).operation;
    if (uVar8 == '\x01') {
      uVar8 = (flow->kd).field_5.map_peer.protocol;
      if (uVar8 == '\x06') {
        uVar8 = '\x02';
      }
      else {
        if (uVar8 != '\x11') {
          return puVar3;
        }
        uVar8 = '\x01';
      }
      puVar3[1] = uVar8;
      *puVar3 = '\0';
      uVar2 = flow->lifetime;
      *(uint *)(puVar3 + 8) =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      *(uint16_t *)(puVar3 + 4) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar3 + 6) = (flow->field_5).map_peer.ext_port;
      flow->pcp_msg_len = 0xc;
      return puVar3;
    }
    if (uVar8 == '\0') {
      puVar3[0] = '\0';
      puVar3[1] = '\0';
      flow->pcp_msg_len = 2;
      return puVar3;
    }
    return puVar3;
  }
  *puVar3 = ppVar9->pcp_version;
  puVar3[1] = puVar3[1] | (flow->kd).operation & 0x7f;
  uVar2 = flow->lifetime;
  *(uint *)(puVar3 + 4) =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  uVar4 = (flow->kd).src_ip.__in6_u.__u6_addr32[1];
  uVar5 = (flow->kd).src_ip.__in6_u.__u6_addr32[2];
  uVar6 = (flow->kd).src_ip.__in6_u.__u6_addr32[3];
  *(uint32_t *)(puVar3 + 8) = (flow->kd).src_ip.__in6_u.__u6_addr32[0];
  *(uint32_t *)(puVar3 + 0xc) = uVar4;
  *(uint32_t *)(puVar3 + 0x10) = uVar5;
  *(uint32_t *)(puVar3 + 0x14) = uVar6;
  flow->pcp_msg_len = 0x18;
  bVar11 = (flow->kd).operation;
  if (3 < bVar11) {
LAB_0010604b:
    pcp_logger(PCP_LOGLVL_ERR,"%s","Unsupported operation.");
    free(flow->pcp_msg_buffer);
    flow->pcp_msg_buffer = (char *)0x0;
    flow->pcp_msg_len = 0;
    return (void *)0x0;
  }
  puVar1 = puVar3 + 0x18;
  switch(bVar11) {
  case 0:
    goto switchD_00105f02_caseD_0;
  case 1:
    if (ppVar9->pcp_version == '\x02') {
      puVar3[0x24] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar3 + 0x28) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar3 + 0x2a) = (flow->field_5).map_peer.ext_port;
      uVar7 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar3 + 0x2c) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar3 + 0x34) = uVar7;
      *(uint32_t *)(puVar3 + 0x20) = (flow->kd).nonce.n[2];
      *(undefined8 *)puVar1 = *(undefined8 *)(flow->kd).nonce.n;
      lVar12 = 0x3c;
    }
    else {
      if (ppVar9->pcp_version != '\x01') goto LAB_0010604b;
      puVar3[0x18] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar3 + 0x1c) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar3 + 0x1e) = (flow->field_5).map_peer.ext_port;
      uVar7 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar3 + 0x20) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar3 + 0x28) = uVar7;
      lVar12 = 0x30;
    }
    break;
  case 2:
    if (ppVar9->pcp_version == '\x02') {
      puVar3[0x24] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar3 + 0x28) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar3 + 0x2a) = (flow->field_5).map_peer.ext_port;
      *(uint16_t *)(puVar3 + 0x3c) = (flow->kd).field_5.map_peer.dst_port;
      uVar7 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar3 + 0x2c) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar3 + 0x34) = uVar7;
      uVar7 = *(undefined8 *)((long)&(flow->kd).field_5 + 0xc);
      *(undefined8 *)(puVar3 + 0x40) = *(undefined8 *)((long)&(flow->kd).field_5 + 4);
      *(undefined8 *)(puVar3 + 0x48) = uVar7;
      *(undefined8 *)puVar1 = *(undefined8 *)(flow->kd).nonce.n;
      *(uint32_t *)(puVar3 + 0x20) = (flow->kd).nonce.n[2];
      lVar12 = 0x50;
    }
    else {
      if (ppVar9->pcp_version != '\x01') goto LAB_0010604b;
      puVar3[0x18] = (flow->kd).field_5.map_peer.protocol;
      *(uint16_t *)(puVar3 + 0x1c) = (flow->kd).field_5.map_peer.src_port;
      *(uint16_t *)(puVar3 + 0x1e) = (flow->field_5).map_peer.ext_port;
      *(uint16_t *)(puVar3 + 0x30) = (flow->kd).field_5.map_peer.dst_port;
      uVar7 = *(undefined8 *)((long)&flow->field_5 + 8);
      *(undefined8 *)(puVar3 + 0x20) = *(undefined8 *)&flow->field_5;
      *(undefined8 *)(puVar3 + 0x28) = uVar7;
      uVar7 = *(undefined8 *)((long)&(flow->kd).field_5 + 0xc);
      *(undefined8 *)(puVar3 + 0x34) = *(undefined8 *)((long)&(flow->kd).field_5 + 4);
      *(undefined8 *)(puVar3 + 0x3c) = uVar7;
      lVar12 = 0x44;
    }
    break;
  case 3:
    if (ppVar9->pcp_version != '\x02') goto LAB_0010604b;
    *(uint32_t *)(puVar3 + 0x20) = (flow->kd).nonce.n[2];
    *(undefined8 *)puVar1 = *(undefined8 *)(flow->kd).nonce.n;
    puVar3[0x24] = (flow->field_5).sadscp.toler_fields;
    bVar11 = (flow->field_5).sadscp.app_name_length;
    bVar11 = ((bVar11 ^ 1) + 1 & 3) + bVar11;
    puVar3[0x25] = bVar11;
    __n = (ulong)(flow->field_5).sadscp.app_name_length;
    if (flow->sadscp_app_name == (char *)0x0) {
      memset(puVar3 + 0x26,0,__n);
    }
    else {
      memcpy(puVar3 + 0x26,flow->sadscp_app_name,__n);
    }
    lVar12 = (ulong)bVar11 + 0x26;
  }
  build_pcp_options(flow,puVar3 + lVar12);
switchD_00105f02_caseD_0:
  return puVar3;
}

Assistant:

void *build_pcp_msg(pcp_flow_t *flow) {
    ssize_t ret = -1;
    pcp_server_t *pcp_server = NULL;
    pcp_request_t *req;
    // pointer used for referencing next data structure in linked list
    void *next_data = NULL;

    PCP_LOG_BEGIN(PCP_LOGLVL_DEBUG);

    if (!flow) {
        return NULL;
    }

    pcp_server = get_pcp_server(flow->ctx, flow->pcp_server_indx);

    if (!pcp_server) {
        return NULL;
    }

    if (!flow->pcp_msg_buffer) {
        flow->pcp_msg_buffer = (char *)calloc(1, PCP_MAX_LEN);
        if (flow->pcp_msg_buffer == NULL) {
            PCP_LOG(PCP_LOGLVL_ERR, "%s",
                    "Malloc can't allocate enough memory for the pcp_flow.");
            PCP_LOG_END(PCP_LOGLVL_DEBUG);
            return NULL;
        }
    }

    req = (pcp_request_t *)flow->pcp_msg_buffer;

    if (pcp_server->pcp_version == 0) {
        // NATPMP
#ifndef PCP_DISABLE_NATPMP
        ret = build_natpmp_msg(flow);
#endif
    } else {

        req->ver = pcp_server->pcp_version;

        req->r_opcode |= (uint8_t)(flow->kd.operation & 0x7f); // set  opcode
        req->req_lifetime = htonl((uint32_t)flow->lifetime);

        memcpy(&req->ip, &flow->kd.src_ip, 16);
        // next data in the packet
        next_data = req->next_data;
        flow->pcp_msg_len = (uint8_t *)next_data - (uint8_t *)req;

        switch (flow->kd.operation) {
        case PCP_OPCODE_PEER:
            ret = build_pcp_peer(pcp_server, flow, next_data);
            break;
        case PCP_OPCODE_MAP:
            ret = build_pcp_map(pcp_server, flow, next_data);
            break;
#ifdef PCP_SADSCP
        case PCP_OPCODE_SADSCP:
            ret = build_pcp_sadscp(pcp_server, flow, next_data);
            break;
#endif
        case PCP_OPCODE_ANNOUNCE:
            ret = 0;
            break;
        }
    }

    if (ret < 0) {
        PCP_LOG(PCP_LOGLVL_ERR, "%s", "Unsupported operation.");
        free(flow->pcp_msg_buffer);
        flow->pcp_msg_buffer = NULL;
        flow->pcp_msg_len = 0;
        req = NULL;
    }

    PCP_LOG_END(PCP_LOGLVL_DEBUG);
    return req;
}